

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataFilter.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter
          (MinefieldDataFilter *this,KBOOL GroundBurialDepthOffset,KBOOL WaterBurialDepthOffset,
          KBOOL SnowBurialDepthOffset,KBOOL MineOrientation,KBOOL ThermalContrast,KBOOL Reflectance,
          KBOOL MineEmplacementAge,KBOOL TripDetonationWire,KBOOL Fusing,
          KBOOL ScalarDetectionCoefficient,KBOOL PaintScheme)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined3 in_register_00000031;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__MinefieldDataFilter_00225210;
  (this->m_FilterUnion).m_ui32Filter =
       (uint)PaintScheme << 10 | (uint)ScalarDetectionCoefficient << 9 | (uint)Fusing << 8 |
       (uint)TripDetonationWire << 7 | (uint)MineEmplacementAge << 6 |
       (uint)Reflectance << 5 |
       CONCAT31(in_register_00000089,ThermalContrast) << 4 |
       CONCAT31(in_register_00000031,GroundBurialDepthOffset) +
       (int)CONCAT71(in_register_00000011,WaterBurialDepthOffset) * 2 +
       (int)CONCAT71(in_register_00000009,SnowBurialDepthOffset) * 4 +
       CONCAT31(in_register_00000081,MineOrientation) * 8;
  return;
}

Assistant:

MinefieldDataFilter::MinefieldDataFilter( KBOOL GroundBurialDepthOffset, KBOOL WaterBurialDepthOffset, KBOOL SnowBurialDepthOffset,
        KBOOL MineOrientation, KBOOL ThermalContrast, KBOOL Reflectance, KBOOL MineEmplacementAge,
        KBOOL TripDetonationWire, KBOOL Fusing, KBOOL ScalarDetectionCoefficient, KBOOL PaintScheme )
{
    m_FilterUnion.m_ui32GroundOffset = GroundBurialDepthOffset;
    m_FilterUnion.m_ui32WaterOffset  = WaterBurialDepthOffset;
    m_FilterUnion.m_ui32SnowOffset   = SnowBurialDepthOffset;
    m_FilterUnion.m_ui32MineOri      = MineOrientation;
    m_FilterUnion.m_ui32ThermalCon   = ThermalContrast;
    m_FilterUnion.m_ui32Reflectance  = Reflectance;
    m_FilterUnion.m_ui32MineEmpAge   = MineEmplacementAge;
    m_FilterUnion.m_ui32TripDetWire  = TripDetonationWire;
    m_FilterUnion.m_ui32Fusing       = Fusing;
    m_FilterUnion.m_ui32ScalarDet    = ScalarDetectionCoefficient;
    m_FilterUnion.m_ui32PaintScm     = PaintScheme;
    m_FilterUnion.m_ui32Padding      = 0;
}